

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O2

void http_parse_query(http_s *h)

{
  size_t sVar1;
  FIOBJ FVar2;
  char *pcVar3;
  void *pvVar4;
  char *pcVar5;
  char *pcVar6;
  fio_str_info_s q;
  
  FVar2 = h->query;
  if (FVar2 != 0) {
    if (h->params == 0) {
      FVar2 = fiobj_hash_new();
      h->params = FVar2;
      FVar2 = h->query;
    }
    fiobj_obj2cstr(&q,FVar2);
    do {
      pcVar6 = q.data;
      sVar1 = q.len;
      pcVar3 = (char *)memchr(q.data,0x26,q.len);
      pcVar5 = pcVar6 + sVar1;
      if (pcVar3 != (char *)0x0) {
        pcVar5 = pcVar3;
      }
      pvVar4 = memchr(pcVar6,0x3d,(long)pcVar5 - (long)pcVar6);
      if (pvVar4 != (void *)0x0) {
        http_add2hash(h->params,pcVar6,(long)pvVar4 - (long)pcVar6,(char *)((long)pvVar4 + 1),
                      (long)pcVar5 - ((long)pvVar4 + 1),'\x01');
      }
      pcVar6 = pcVar5;
      if ((((*pcVar5 == '&') && (pcVar6 = pcVar5 + 1, pcVar5[1] == 'a')) && (pcVar5[2] == 'm')) &&
         ((pcVar5[3] == 'p' && (pcVar5[4] == ';')))) {
        pcVar6 = pcVar5 + 5;
      }
      q.len = (size_t)(q.data + (q.len - (long)pcVar6));
      q.data = pcVar6;
    } while ((char *)q.len != (char *)0x0);
  }
  return;
}

Assistant:

void http_parse_query(http_s *h) {
  if (!h->query)
    return;
  if (!h->params)
    h->params = fiobj_hash_new();
  fio_str_info_s q = fiobj_obj2cstr(h->query);
  do {
    char *cut = memchr(q.data, '&', q.len);
    if (!cut)
      cut = q.data + q.len;
    char *cut2 = memchr(q.data, '=', (cut - q.data));
    if (cut2) {
      /* we only add named elements... */
      http_add2hash(h->params, q.data, (size_t)(cut2 - q.data), (cut2 + 1),
                    (size_t)(cut - (cut2 + 1)), 1);
    }
    if (cut[0] == '&') {
      /* protecting against some ...less informed... clients */
      if (cut[1] == 'a' && cut[2] == 'm' && cut[3] == 'p' && cut[4] == ';')
        cut += 5;
      else
        cut += 1;
    }
    q.len -= (uintptr_t)(cut - q.data);
    q.data = cut;
  } while (q.len);
}